

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sutil.c
# Opt level: O3

void sCopy_CompCol_Matrix(SuperMatrix *A,SuperMatrix *B)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  long lVar5;
  Dtype_t DVar6;
  Mtype_t MVar7;
  int_t iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  
  DVar6 = A->Dtype;
  MVar7 = A->Mtype;
  iVar8 = A->nrow;
  B->Stype = A->Stype;
  B->Dtype = DVar6;
  B->Mtype = MVar7;
  B->nrow = iVar8;
  uVar1 = A->ncol;
  B->ncol = uVar1;
  piVar3 = (int *)A->Store;
  piVar4 = (int *)B->Store;
  iVar2 = *piVar3;
  lVar9 = (long)iVar2;
  *piVar4 = iVar2;
  if (0 < lVar9) {
    lVar5 = *(long *)(piVar3 + 2);
    lVar10 = *(long *)(piVar4 + 2);
    lVar11 = 0;
    do {
      *(undefined4 *)(lVar10 + lVar11 * 4) = *(undefined4 *)(lVar5 + lVar11 * 4);
      lVar11 = lVar11 + 1;
    } while (lVar9 != lVar11);
    if (0 < iVar2) {
      lVar5 = *(long *)(piVar3 + 4);
      lVar10 = *(long *)(piVar4 + 4);
      lVar11 = 0;
      do {
        *(undefined4 *)(lVar10 + lVar11 * 4) = *(undefined4 *)(lVar5 + lVar11 * 4);
        lVar11 = lVar11 + 1;
      } while (lVar9 != lVar11);
    }
  }
  if (-1 < (int)uVar1) {
    lVar9 = *(long *)(piVar3 + 6);
    lVar5 = *(long *)(piVar4 + 6);
    lVar10 = 0;
    do {
      *(undefined4 *)(lVar5 + lVar10 * 4) = *(undefined4 *)(lVar9 + lVar10 * 4);
      lVar10 = lVar10 + 1;
    } while ((ulong)uVar1 + 1 != lVar10);
  }
  return;
}

Assistant:

void
sCopy_CompCol_Matrix(SuperMatrix *A, SuperMatrix *B)
{
    NCformat *Astore, *Bstore;
    int      ncol, nnz, i;

    B->Stype = A->Stype;
    B->Dtype = A->Dtype;
    B->Mtype = A->Mtype;
    B->nrow  = A->nrow;;
    B->ncol  = ncol = A->ncol;
    Astore   = (NCformat *) A->Store;
    Bstore   = (NCformat *) B->Store;
    Bstore->nnz = nnz = Astore->nnz;
    for (i = 0; i < nnz; ++i)
	((float *)Bstore->nzval)[i] = ((float *)Astore->nzval)[i];
    for (i = 0; i < nnz; ++i) Bstore->rowind[i] = Astore->rowind[i];
    for (i = 0; i <= ncol; ++i) Bstore->colptr[i] = Astore->colptr[i];
}